

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cc
# Opt level: O1

Pivot * __thiscall fizplex::Base::find_pivot(Pivot *__return_storage_ptr__,Base *this,size_t ind)

{
  double dVar1;
  size_t sVar2;
  bool bVar3;
  long lVar4;
  size_t sVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar6 [16];
  undefined1 local_48 [16];
  
  *(undefined8 *)__return_storage_ptr__ = 0;
  __return_storage_ptr__->value = 0.0;
  __return_storage_ptr__->index = 0;
  if (ind < this->m) {
    local_48._8_8_ = 0;
    local_48._0_8_ = __return_storage_ptr__->value;
    sVar2 = __return_storage_ptr__->index;
    lVar4 = ind << 5;
    bVar3 = false;
    sVar5 = ind;
    do {
      dVar1 = SVector::get_value((SVector *)
                                 ((long)&(((this->etms).
                                           super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->eta).values +
                                 lVar4),ind);
      if (1e-07 < ABS(dVar1)) {
        if (bVar3) {
          auVar6._8_4_ = (int)(local_48._0_8_ & 0x7fffffffffffffff);
          auVar6._0_8_ = ABS(dVar1);
          auVar6._12_4_ = (int)((local_48._0_8_ & 0x7fffffffffffffff) >> 0x20);
          auVar6 = divpd(_DAT_00112bb0,auVar6);
          if (ABS(DAT_00112bb0._8_8_ - auVar6._8_8_) <= ABS((double)DAT_00112bb0 - auVar6._0_8_))
          goto LAB_00111469;
        }
        bVar3 = true;
        local_48._8_4_ = extraout_XMM0_Dc;
        local_48._0_8_ = dVar1;
        local_48._12_4_ = extraout_XMM0_Dd;
        sVar2 = sVar5;
      }
LAB_00111469:
      sVar5 = sVar5 + 1;
      lVar4 = lVar4 + 0x20;
    } while (sVar5 < this->m);
    __return_storage_ptr__->value = (double)local_48._0_8_;
    __return_storage_ptr__->index = sVar2;
  }
  else {
    bVar3 = false;
  }
  __return_storage_ptr__->found = bVar3;
  return __return_storage_ptr__;
}

Assistant:

Base::Pivot Base::find_pivot(size_t ind) const {
  static const auto dist_to_one = [](double d) {
    return std::fabs(1 - 1.0 / std::fabs(d));
  };
  Pivot pivot{false, 0, 0};
  for (size_t j = ind; j < m; j++) { // Find etm with non-zero in ind
    auto val = etms[j].eta.get_value(ind);
    if (is_zero(val))
      continue;
    if (not pivot.found or (dist_to_one(val) < dist_to_one(pivot.value))) {
      pivot.found = true;
      pivot.index = j;
      pivot.value = val;
    }
  }
  return pivot;
}